

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::set_curr_func(Plotter *this,size_t func_id)

{
  color *other;
  ulong __val;
  bool bVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  float ***pppfVar5;
  char cVar6;
  size_t sVar7;
  string __str;
  Function f;
  color local_1b0;
  color local_180;
  Function local_150;
  
  sVar7 = func_id;
  if (this->curr_func != func_id) {
    (this->func_error)._M_string_length = 0;
    *(this->func_error)._M_dataplus._M_p = '\0';
    sVar7 = this->curr_func;
  }
  if (sVar7 < (ulong)(((long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->funcs).
                             super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5))
  {
    reparse_expr(this,sVar7);
    sVar7 = this->curr_func;
  }
  if (sVar7 != func_id) {
    this->curr_func = func_id;
    if (func_id != 0xffffffffffffffff) {
      this->focus_on_editor = true;
    }
    this->require_update = true;
  }
  if (((long)(this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->funcs).super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x79435e50d79435e5 - func_id == 0) {
    Function::Function(&local_150);
    local_150.type = 0;
    other = (this->reuse_colors).
            super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
    if ((this->reuse_colors).
        super__Deque_base<nivalis::color::color,_std::allocator<nivalis::color::color>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == other) {
      sVar7 = this->last_expr_color;
      this->last_expr_color = sVar7 + 1;
      color::from_int(&local_1b0,sVar7);
      color::color::operator=(&local_180,&local_150.line_color,&local_1b0);
    }
    else {
      color::color::operator=(&local_1b0,&local_150.line_color,other);
      std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::pop_front
                (&this->reuse_colors);
    }
    __val = this->next_func_name;
    this->next_func_name = __val + 1;
    cVar6 = '\x01';
    if (9 < __val) {
      uVar4 = __val;
      cVar2 = '\x04';
      do {
        cVar6 = cVar2;
        if (uVar4 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_00129fe2;
        }
        if (uVar4 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_00129fe2;
        }
        if (uVar4 < 10000) goto LAB_00129fe2;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar6 + '\x04';
      } while (bVar1);
      cVar6 = cVar6 + '\x01';
    }
LAB_00129fe2:
    local_1b0.data._0_8_ = &local_1b0.r;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1b0.data._0_8_,(uint)local_1b0.data[2],__val);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x25f392);
    pppfVar5 = (float ***)(plVar3 + 2);
    if ((float ***)*plVar3 == pppfVar5) {
      local_180.r = (float *)*pppfVar5;
      local_180.g = (float *)plVar3[3];
      local_180.data._0_8_ = &local_180.r;
    }
    else {
      local_180.r = (float *)*pppfVar5;
      local_180.data._0_8_ = (float ***)*plVar3;
    }
    local_180.data._8_8_ = plVar3[1];
    *plVar3 = (long)pppfVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((float **)local_1b0.data._0_8_ != &local_1b0.r) {
      operator_delete((void *)local_1b0.data._0_8_,(long)local_1b0.r + 1);
    }
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_180);
    if ((float **)local_180.data._0_8_ != &local_180.r) {
      operator_delete((void *)local_180.data._0_8_,(long)local_180.r + 1);
    }
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::
    emplace_back<nivalis::Function>(&this->funcs,&local_150);
    Function::~Function(&local_150);
  }
  return;
}

Assistant:

void Plotter::set_curr_func(size_t func_id) {
    if (func_id != curr_func)
        func_error.clear();
    if (curr_func < funcs.size())
        reparse_expr(curr_func);
    if (curr_func != func_id) {
        curr_func = func_id;
        if (~curr_func) focus_on_editor = true;
        require_update = true;
    }
    if (curr_func == funcs.size()) {
        // New function
        Function f;
        f.type = Function::FUNC_TYPE_EXPLICIT;
        if (reuse_colors.empty()) {
            f.line_color =
                color::from_int(last_expr_color++);
        } else {
            f.line_color = reuse_colors.front();
            reuse_colors.pop_front();
        }
        f.name = gen_func_name(use_latex, next_func_name++);
        funcs.push_back(std::move(f));
    }
}